

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O2

T __thiscall adios2::VariableNT::Max(VariableNT *this,size_t step)

{
  VariableBase *pVVar1;
  undefined1 auVar2 [16];
  undefined7 uVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined4 uVar7;
  T TVar8;
  undefined8 local_108;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pVVar1 = this->m_Variable;
  std::__cxx11::string::string
            ((string *)&local_38,"in call to VariableNT::Max",(allocator *)&local_f8);
  helper::CheckForNullptr<adios2::core::VariableBase>(pVVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pVVar1 = this->m_Variable;
  uVar3 = local_108._1_7_;
  switch(*(undefined4 *)(pVVar1 + 0x28)) {
  case 1:
    uVar4 = adios2::core::Variable<signed_char>::Max((ulong)pVVar1);
    uVar6 = extraout_RDX;
    goto LAB_001e4022;
  case 2:
    uVar5 = adios2::core::Variable<short>::Max((ulong)pVVar1);
    uVar6 = extraout_RDX_03;
    goto LAB_001e4073;
  case 3:
    uVar7 = adios2::core::Variable<int>::Max((ulong)pVVar1);
    uVar6 = extraout_RDX_02;
    goto LAB_001e4084;
  case 4:
    TVar8 = (T)adios2::core::Variable<long>::Max((ulong)pVVar1);
    break;
  case 5:
    uVar4 = adios2::core::Variable<unsigned_char>::Max((ulong)pVVar1);
    uVar6 = extraout_RDX_00;
LAB_001e4022:
    local_108 = CONCAT71(uVar3,uVar4);
    TVar8._8_8_ = uVar6;
    TVar8.Int64 = local_108;
    break;
  case 6:
    uVar5 = adios2::core::Variable<unsigned_short>::Max((ulong)pVVar1);
    uVar6 = extraout_RDX_04;
LAB_001e4073:
    local_108 = CONCAT62(local_108._2_6_,uVar5);
    TVar8._8_8_ = uVar6;
    TVar8.Int64 = local_108;
    break;
  case 7:
    uVar7 = adios2::core::Variable<unsigned_int>::Max((ulong)pVVar1);
    uVar6 = extraout_RDX_05;
LAB_001e4084:
    local_108 = CONCAT44(local_108._4_4_,uVar7);
    TVar8._8_8_ = uVar6;
    TVar8.Int64 = local_108;
    break;
  case 8:
    TVar8 = (T)adios2::core::Variable<unsigned_long>::Max((ulong)pVVar1);
    break;
  case 9:
    uVar7 = adios2::core::Variable<float>::Max((ulong)pVVar1);
    local_108 = CONCAT44(local_108._4_4_,uVar7);
    TVar8._8_8_ = extraout_RDX_07;
    TVar8.Int64 = local_108;
    break;
  case 10:
    uVar6 = adios2::core::Variable<double>::Max((ulong)pVVar1);
    TVar8._8_8_ = extraout_RDX_01;
    TVar8.Int64 = uVar6;
    break;
  default:
    std::__cxx11::string::string((string *)&local_f8,"bindings::CXX11",&local_f9);
    std::__cxx11::string::string((string *)&local_58,"VariableNT",&local_fa);
    std::__cxx11::string::string((string *)&local_78,"Max",&local_fb);
    adios2::ToString_abi_cxx11_((DataType)&local_d8);
    std::operator+(&local_b8,"invalid data type ",&local_d8);
    std::operator+(&local_98,&local_b8,", only basic numeric types support this API");
    helper::Throw<std::runtime_error>(&local_f8,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_f8);
    auVar2._7_8_ = extraout_RDX_06;
    auVar2._0_7_ = uVar3;
    auVar2[0xf] = 0;
    TVar8 = (T)(auVar2 << 8);
  }
  return TVar8;
}

Assistant:

VariableNT::T VariableNT::Max(const size_t step) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::Max");
    if (m_Variable->m_Type == DataType::Int8)
    {
        VariableNT::T ret = {0};
        ret.Int8 = reinterpret_cast<core::Variable<int8_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt8)
    {
        VariableNT::T ret = {0};
        ret.UInt8 = reinterpret_cast<core::Variable<uint8_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Int16)
    {
        VariableNT::T ret = {0};
        ret.Int16 = reinterpret_cast<core::Variable<int16_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt16)
    {
        VariableNT::T ret = {0};
        ret.UInt16 = reinterpret_cast<core::Variable<uint16_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Int32)
    {
        VariableNT::T ret = {0};
        ret.Int32 = reinterpret_cast<core::Variable<int32_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt32)
    {
        VariableNT::T ret = {0};
        ret.UInt32 = reinterpret_cast<core::Variable<uint32_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Int64)
    {
        VariableNT::T ret = {0};
        ret.Int64 = reinterpret_cast<core::Variable<int64_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::UInt64)
    {
        VariableNT::T ret = {0};
        ret.UInt64 = reinterpret_cast<core::Variable<uint64_t> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Float)
    {
        VariableNT::T ret = {0};
        ret.Float = reinterpret_cast<core::Variable<float> *>(m_Variable)->Max(step);
        return ret;
    }
    else if (m_Variable->m_Type == DataType::Double)
    {
        VariableNT::T ret = {0};
        ret.Double = reinterpret_cast<core::Variable<double> *>(m_Variable)->Max(step);
        return ret;
    }
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "Max",
                                      "invalid data type " + ToString(m_Variable->m_Type) +
                                          ", only basic numeric types support this API");
    return {0};
}